

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

char * nifti_makeimgname(char *prefix,int nifti_type,int check,int comp)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  char local_51 [8];
  char extgz [5];
  char extnia [5];
  char extimg [5];
  char exthdr [5];
  char extnii [5];
  char *ext;
  char *iname;
  int comp_local;
  int check_local;
  int nifti_type_local;
  char *prefix_local;
  
  stack0xffffffffffffffc3 = 0x69696e2e;
  stack0xffffffffffffffbe = 0x7264682e;
  extimg[1] = '\0';
  stack0xffffffffffffffb9 = 0x676d692e;
  extnia[1] = '\0';
  stack0xffffffffffffffb4 = 0x61696e2e;
  extgz[1] = '\0';
  local_51[0] = '.';
  local_51[1] = 'g';
  local_51[2] = 'z';
  local_51[3] = '\0';
  local_51[4] = 0;
  iVar1 = nifti_validfilename(prefix);
  if (iVar1 == 0) {
    prefix_local = (char *)0x0;
  }
  else {
    sVar2 = strlen(prefix);
    prefix_local = (char *)calloc(1,sVar2 + 8);
    if (prefix_local == (char *)0x0) {
      fprintf(_stderr,"** small malloc failure!\n");
      prefix_local = (char *)0x0;
    }
    else {
      strcpy(prefix_local,prefix);
      pcVar3 = nifti_find_file_extension(prefix_local);
      if (pcVar3 == (char *)0x0) {
        if (nifti_type == 1) {
          strcat(prefix_local,extimg + 2);
        }
        else if (nifti_type == 3) {
          strcat(prefix_local,local_51 + 5);
        }
        else {
          strcat(prefix_local,extgz + 2);
        }
      }
      else {
        iVar1 = is_uppercase(pcVar3);
        if (iVar1 != 0) {
          make_uppercase(extimg + 2);
          make_uppercase(extnia + 2);
          make_uppercase(extgz + 2);
          make_uppercase(local_51 + 5);
          make_uppercase(local_51);
        }
        iVar1 = strncmp(pcVar3,extnia + 2,4);
        if (iVar1 == 0) {
          sVar2 = strlen(prefix_local);
          sVar4 = strlen(pcVar3);
          *(undefined4 *)(prefix_local + (sVar2 - sVar4)) = stack0xffffffffffffffb9;
        }
      }
      if ((comp != 0) &&
         ((pcVar3 == (char *)0x0 || (pcVar3 = strstr(prefix_local,local_51), pcVar3 == (char *)0x0))
         )) {
        strcat(prefix_local,local_51);
      }
      if ((check == 0) || (iVar1 = nifti_fileexists(prefix_local), iVar1 == 0)) {
        if (2 < g_opts.debug) {
          fprintf(_stderr,"+d made image filename \'%s\'\n",prefix_local);
        }
      }
      else {
        fprintf(_stderr,"** failure: image file \'%s\' already exists\n",prefix_local);
        free(prefix_local);
        prefix_local = (char *)0x0;
      }
    }
  }
  return prefix_local;
}

Assistant:

char * nifti_makeimgname(const char * prefix, int nifti_type, int check,
                         int comp)
{
   char * iname;
   const char * ext;
   char   extnii[5] = ".nii";   /* modifiable, for possible uppercase */
   char   exthdr[5] = ".hdr";
   char   extimg[5] = ".img";
   char   extnia[5] = ".nia";
   char   extgz[5]  = ".gz";

   if( !nifti_validfilename(prefix) ) return NULL;

   /* add space for extension, optional ".gz", and null char */
   iname = (char *)calloc(sizeof(char),strlen(prefix)+8);
   if( !iname ){ fprintf(stderr,"** small malloc failure!\n"); return NULL; }
   strcpy(iname, prefix);

   /* use any valid extension */
   if( (ext = nifti_find_file_extension(iname)) != NULL ){
      /* if uppercase, convert all extensions */
      if( is_uppercase(ext) ) {
         make_uppercase(extnii);
         make_uppercase(exthdr);
         make_uppercase(extimg);
         make_uppercase(extnia);
         make_uppercase(extgz);
      }

      if( strncmp(ext,exthdr,4) == 0 )
      {
         memcpy(&(iname[strlen(iname)-strlen(ext)]),extimg,4);   /* then convert hdr name to img */
      }
   }
   /* otherwise, make one up */
   else if( nifti_type == NIFTI_FTYPE_NIFTI1_1 ) strcat(iname, extnii);
   else if( nifti_type == NIFTI_FTYPE_ASCII )    strcat(iname, extnia);
   else                                          strcat(iname, extimg);

#ifdef HAVE_ZLIB  /* if compression is requested, make sure of suffix */
   if( comp && (!ext || !strstr(iname,extgz)) ) strcat(iname,extgz);
#endif

   /* check for existence failure */
   if( check && nifti_fileexists(iname) ){
      fprintf(stderr,"** failure: image file '%s' already exists\n",iname);
      free(iname);
      return NULL;
   }

   if( g_opts.debug > 2 ) fprintf(stderr,"+d made image filename '%s'\n",iname);

   return iname;
}